

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O0

shared_ptr<Assimp::Blender::ElemBase> __thiscall
Assimp::Blender::DNA::ConvertBlobToStructure(DNA *this,Structure *structure,FileDatabase *db)

{
  long lVar1;
  bool bVar2;
  reference ppVar3;
  _Base_ptr in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<Assimp::Blender::ElemBase> sVar5;
  code *local_b8;
  code *local_98;
  shared_ptr<Assimp::Blender::ElemBase> local_50;
  undefined1 local_39;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  FileDatabase *db_local;
  Structure *structure_local;
  DNA *this_local;
  shared_ptr<Assimp::Blender::ElemBase> *ret;
  
  it._M_node = in_RCX;
  local_30._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>_>
               *)structure,(key_type *)db);
  local_38._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>_>
              *)structure);
  bVar2 = ::std::operator==(&local_30,&local_38);
  if (bVar2) {
    ::std::shared_ptr<Assimp::Blender::ElemBase>::shared_ptr
              ((shared_ptr<Assimp::Blender::ElemBase> *)this);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    local_39 = 0;
    ppVar3 = ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>
             ::operator*(&local_30);
    local_98 = (code *)(ppVar3->second).first;
    if (((ulong)local_98 & 1) != 0) {
      local_98 = *(code **)(local_98 +
                           *(long *)(&db->i64bit + *(long *)&(ppVar3->second).field_0x8) + -1);
    }
    (*local_98)(this,&db->i64bit + *(long *)&(ppVar3->second).field_0x8);
    ppVar3 = ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>
             ::operator*(&local_30);
    local_b8 = (code *)(ppVar3->second).second;
    lVar1 = *(long *)&(ppVar3->second).field_0x18;
    if (((ulong)local_b8 & 1) != 0) {
      local_b8 = *(code **)(local_b8 + *(long *)(&db->i64bit + lVar1) + -1);
    }
    ::std::shared_ptr<Assimp::Blender::ElemBase>::shared_ptr
              (&local_50,(shared_ptr<Assimp::Blender::ElemBase> *)this);
    (*local_b8)(&db->i64bit + lVar1,&local_50,it._M_node);
    ::std::shared_ptr<Assimp::Blender::ElemBase>::~shared_ptr(&local_50);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var4._M_pi;
  sVar5.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Assimp::Blender::ElemBase>)
         sVar5.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr< ElemBase > DNA :: ConvertBlobToStructure(
    const Structure& structure,
    const FileDatabase& db
) const
{
    std::map<std::string, FactoryPair >::const_iterator it = converters.find(structure.name);
    if (it == converters.end()) {
        return std::shared_ptr< ElemBase >();
    }

    std::shared_ptr< ElemBase > ret = (structure.*((*it).second.first))();
    (structure.*((*it).second.second))(ret,db);

    return ret;
}